

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O0

bool helics::changeDetected(defV *prevValue,Time val,double deltaV)

{
  char *pcVar1;
  int in_EDX;
  int __c;
  char *in_RSI;
  int iVar2;
  variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  *in_RDI;
  TimeRepresentation<count_time<9,_long>_> *in_XMM0_Qa;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  undefined4 in_stack_ffffffffffffffd0;
  time_units in_stack_ffffffffffffffd4;
  TimeRepresentation<count_time<9,_long>_> *in_stack_ffffffffffffffd8;
  undefined1 local_10 [15];
  bool local_1;
  
  pcVar1 = CLI::std::
           variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
           ::index(in_RDI,in_RSI,in_EDX);
  if (pcVar1 == (char *)0x0) {
    std::
    get<double,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
              ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                *)0x3a107e);
    iVar2 = (int)local_10;
    TimeRepresentation::operator_cast_to_double
              ((TimeRepresentation<count_time<9,_long>_> *)0x3a1091);
    std::abs(iVar2);
    local_1 = (double)in_XMM0_Qa < extraout_XMM0_Qa;
  }
  else {
    pcVar1 = CLI::std::
             variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
             ::index(in_RDI,in_RSI,__c);
    if (pcVar1 == (char *)0x1) {
      std::
      get<long,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                  *)0x3a10cd);
      TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
                (in_XMM0_Qa,(int64_t)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
      TimeRepresentation<count_time<9,_long>_>::operator-
                (in_stack_ffffffffffffffd8,
                 (TimeRepresentation<count_time<9,_long>_> *)
                 CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      iVar2 = (int)&stack0xffffffffffffffd8;
      TimeRepresentation::operator_cast_to_double
                ((TimeRepresentation<count_time<9,_long>_> *)0x3a10fd);
      std::abs(iVar2);
      local_1 = (double)in_XMM0_Qa < extraout_XMM0_Qa_00;
    }
    else {
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool changeDetected(const defV& prevValue, Time val, double deltaV)
{
    if (prevValue.index() == double_loc) {
        return (std::abs(std::get<double>(prevValue) - static_cast<double>(val)) > deltaV);
    }
    if (prevValue.index() == int_loc) {
        return (std::abs(Time(std::get<int64_t>(prevValue), time_units::ns) - val) > deltaV);
    }
    return true;
}